

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_pruning.hpp
# Opt level: O0

pair<unsigned_long,_unsigned_long>
IntegratorXX::detail::get_robust_low_med_sizes<IntegratorXX::Delley<double>>(AngularSize asz)

{
  runtime_error *this;
  pair<unsigned_long,_unsigned_long> pVar1;
  int64_t local_68;
  unsigned_long local_58;
  AngularSize low_sz;
  AngularSize med_sz;
  int64_t low_order;
  int64_t med_order;
  int64_t local_28;
  int64_t base_order;
  AngularSize asz_local;
  
  base_order = asz;
  local_28 = quadrature_traits<IntegratorXX::Delley<double>,_void>::algebraic_order_by_npts(asz);
  if (-1 < local_28) {
    local_68 = local_28;
    if (6 < local_28) {
      local_68 = local_28 + -6;
    }
    low_order = quadrature_traits<IntegratorXX::Delley<double>,_void>::next_algebraic_order
                          (local_68);
    med_sz = quadrature_traits<IntegratorXX::Delley<double>,_void>::next_algebraic_order(7);
    low_sz = quadrature_traits<IntegratorXX::Delley<double>,_void>::npts_by_algebraic_order
                       (low_order);
    local_58 = quadrature_traits<IntegratorXX::Delley<double>,_void>::npts_by_algebraic_order
                         (med_sz);
    pVar1 = std::make_pair<unsigned_long&,unsigned_long&>(&local_58,&low_sz);
    return pVar1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Invalid Base Grid");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto get_robust_low_med_sizes(AngularSize asz) {
  using traits = quadrature_traits<AngularQuad>;
  const auto base_order = traits::algebraic_order_by_npts(asz);
  if( base_order < 0 ) throw std::runtime_error("Invalid Base Grid");

  const auto med_order = 
    traits::next_algebraic_order(base_order > 6 ? base_order-6 : base_order);
  const auto low_order = traits::next_algebraic_order(7);

  AngularSize med_sz(traits::npts_by_algebraic_order(med_order));
  AngularSize low_sz(traits::npts_by_algebraic_order(low_order));

  return std::make_pair(low_sz, med_sz);
}